

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushStyleColor(ImGuiCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  int iVar2;
  ImGuiColMod *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiContext *pIVar8;
  ImGuiColMod *__dest;
  int iVar9;
  int iVar10;
  ImVec4 *pIVar11;
  
  pIVar8 = GImGui;
  pIVar11 = (GImGui->Style).Colors + idx;
  fVar4 = pIVar11->x;
  fVar5 = pIVar11->y;
  pIVar1 = (GImGui->Style).Colors + idx;
  fVar6 = pIVar1->z;
  fVar7 = pIVar1->w;
  iVar10 = (GImGui->ColorModifiers).Size;
  iVar2 = (GImGui->ColorModifiers).Capacity;
  if (iVar10 == iVar2) {
    iVar10 = iVar10 + 1;
    if (iVar2 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar2 / 2 + iVar2;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar2 < iVar10) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __dest = (ImGuiColMod *)(*GImAllocatorAllocFunc)((long)iVar10 * 0x14,GImAllocatorUserData);
      pIVar3 = (pIVar8->ColorModifiers).Data;
      if (pIVar3 != (ImGuiColMod *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar8->ColorModifiers).Size * 0x14);
        pIVar3 = (pIVar8->ColorModifiers).Data;
        if (pIVar3 != (ImGuiColMod *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (pIVar8->ColorModifiers).Data = __dest;
      (pIVar8->ColorModifiers).Capacity = iVar10;
    }
  }
  pIVar3 = (pIVar8->ColorModifiers).Data;
  iVar10 = (pIVar8->ColorModifiers).Size;
  pIVar3[iVar10].Col = idx;
  pIVar1 = &pIVar3[iVar10].BackupValue;
  pIVar1->x = fVar4;
  pIVar1->y = fVar5;
  pIVar1->z = fVar6;
  pIVar1->w = fVar7;
  (pIVar8->ColorModifiers).Size = (pIVar8->ColorModifiers).Size + 1;
  pIVar11->x = (float)(col & 0xff) * 0.003921569;
  (pIVar8->Style).Colors[idx].y = (float)(col >> 8 & 0xff) * 0.003921569;
  (pIVar8->Style).Colors[idx].z = (float)(col >> 0x10 & 0xff) * 0.003921569;
  (pIVar8->Style).Colors[idx].w = (float)(col >> 0x18) * 0.003921569;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorModifiers.push_back(backup);
    g.Style.Colors[idx] = ColorConvertU32ToFloat4(col);
}